

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::convert_to_f32
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr,uint32_t components)

{
  char (*in_R9) [2];
  SPIRType t;
  string local_1b0;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t sStack_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_190._12_4_ = 0x17 - (uint)(components < 2);
  local_190._8_4_ = 0;
  local_190._0_8_ = &PTR__SPIRType_00360128;
  local_190._40_8_ = 0;
  local_190._48_8_ = 8;
  local_190._96_8_ = 0;
  local_190._104_8_ = 8;
  local_190._120_4_ = 0;
  local_190[0x7c] = false;
  local_190[0x7d] = false;
  local_190._128_4_ = 0;
  local_190._132_4_ = 0;
  local_190._136_4_ = 0;
  local_190._140_4_ = 0;
  local_190._144_4_ = StorageClassGeneric;
  local_190._160_8_ = 0;
  local_190._168_8_ = 8;
  sStack_b8 = 0;
  local_b0 = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_6c.id = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = ImageFormatUnknown;
  local_88._20_4_ = AccessQualifierReadOnly;
  local_88._24_4_ = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_190._16_4_ = Float;
  local_190._20_4_ = 0;
  local_190._28_4_ = 1;
  local_190._24_4_ = components;
  local_190._32_8_ = local_190 + 0x38;
  local_190._88_8_ = local_190 + 0x70;
  local_190._152_8_ = (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0);
  local_c0 = local_a8;
  CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
            (&local_1b0,&this->super_CompilerGLSL,(SPIRType *)local_190);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
             (char (*) [2])expr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_190._0_8_ = &PTR__SPIRType_00360128;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  sStack_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::convert_to_f32(const string &expr, uint32_t components)
{
	SPIRType t { components > 1 ? OpTypeVector : OpTypeFloat };
	t.basetype = SPIRType::Float;
	t.vecsize = components;
	t.columns = 1;
	return join(type_to_glsl_constructor(t), "(", expr, ")");
}